

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O0

bool __thiscall GOESRProduct::isComplete(GOESRProduct *this)

{
  bool bVar1;
  size_type sVar2;
  GOESRProduct *in_RDI;
  SegmentIdentificationHeader sih;
  undefined2 local_16;
  undefined1 local_1;
  
  bVar1 = isSegmented(in_RDI);
  if (bVar1) {
    getHeader<lrit::SegmentIdentificationHeader>(in_RDI);
    sVar2 = std::
            vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
            ::size(&in_RDI->files_);
    local_1 = sVar2 == local_16;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GOESRProduct::isComplete() const {
  if (!isSegmented()) {
    return true;
  }

  auto sih = getHeader<lrit::SegmentIdentificationHeader>();
  return files_.size() == sih.maxSegment;
}